

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O1

void __thiscall
ocl::KernelSource::execSubdivided
          (KernelSource *this,WorkSize *ws,Arg *arg0,Arg *arg1,Arg *arg2,Arg *arg3,Arg *arg4,
          Arg *arg5,Arg *arg6,Arg *arg7,Arg *arg8,Arg *arg9,Arg *arg10,Arg *arg11,Arg *arg12,
          Arg *arg13,Arg *arg14,Arg *arg15,Arg *arg16,Arg *arg17,Arg *arg18,Arg *arg19,Arg *arg20,
          Arg *arg21,Arg *arg22,Arg *arg23,Arg *arg24,Arg *arg25,Arg *arg26,Arg *arg27,Arg *arg28,
          Arg *arg29,Arg *arg30,Arg *arg31,Arg *arg32,Arg *arg33,Arg *arg34,Arg *arg35,Arg *arg36,
          Arg *arg37,Arg *arg38,Arg *arg39,Arg *arg40)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  OpenCLKernel *this_00;
  uint uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong local_128;
  undefined1 local_b0 [16];
  WorkSize ws_part;
  size_t offset [3];
  Context context;
  
  uVar1 = ws->localWorkSize[0];
  uVar2 = ws->localWorkSize[1];
  uVar3 = ws->localWorkSize[2];
  uVar4 = ws->globalWorkSize[0];
  uVar5 = ws->globalWorkSize[1];
  uVar6 = ws->globalWorkSize[2];
  uVar18 = uVar4;
  if (uVar1 < uVar4 && 1000000 < uVar6 * uVar5 * uVar4) {
    uVar15 = 1;
    do {
      uVar15 = uVar15 * 2;
      uVar18 = ((ulong)(((int)uVar4 + -1 + uVar15) / uVar15 + (int)uVar1 + -1) /
               (uVar1 & 0xffffffff)) * uVar1;
      if (uVar6 * uVar5 * uVar18 < 0xf4241) break;
    } while (uVar1 <= uVar18 && uVar18 - uVar1 != 0);
  }
  lVar10 = uVar5 * uVar18;
  uVar15 = (uint)uVar2;
  uVar7 = uVar5;
  if (uVar2 < uVar5 && 1000000 < lVar10 * uVar6) {
    uVar16 = 1;
    do {
      uVar16 = uVar16 * 2;
      uVar7 = ((ulong)(((int)uVar5 + -1 + uVar16) / uVar16 + (uVar15 - 1)) / (uVar2 & 0xffffffff)) *
              uVar2;
      lVar10 = uVar7 * uVar18;
      if (lVar10 * uVar6 < 0xf4241) break;
    } while (uVar2 <= uVar7 && uVar7 - uVar2 != 0);
  }
  uVar16 = (uint)uVar3;
  uVar19 = uVar6;
  if (uVar3 < uVar6 && 1000000 < uVar6 * lVar10) {
    uVar8 = 1;
    do {
      uVar8 = uVar8 * 2;
      uVar19 = ((ulong)(((int)uVar6 + -1 + uVar8) / uVar8 + (uVar16 - 1)) / (uVar3 & 0xffffffff)) *
               uVar3;
      if (uVar19 * lVar10 < 0xf4241) break;
    } while (uVar3 <= uVar19 && uVar19 - uVar3 != 0);
  }
  gpu::Context::Context(&context);
  gpu::Context::cl((Context *)&ws_part);
  this_00 = getKernel(this,(shared_ptr<ocl::OpenCLEngine> *)&ws_part,false);
  if (ws_part.localWorkSize[1] != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ws_part.localWorkSize[1]);
  }
  OpenCLKernel::setArgs
            (this_00,arg0,arg1,arg2,arg3,arg4,arg5,arg6,arg7,arg8,arg9,arg10,arg11,arg12,arg13,arg14
             ,arg15,arg16,arg17,arg18,arg19,arg20,arg21,arg22,arg23,arg24,arg25,arg26,arg27,arg28,
             arg29,arg30,arg31,arg32,arg33,arg34,arg35,arg36,arg37,arg38,arg39,arg40);
  if (uVar4 != 0) {
    local_128 = 0;
    do {
      if (uVar5 != 0) {
        uVar17 = uVar4 - local_128;
        if (uVar18 <= uVar4 - local_128) {
          uVar17 = uVar18;
        }
        uVar8 = (int)uVar17 + (int)uVar1 + -1;
        uVar17 = 0;
        do {
          if (uVar6 != 0) {
            uVar14 = uVar5 - uVar17;
            if (uVar7 <= uVar5 - uVar17) {
              uVar14 = uVar7;
            }
            uVar13 = (int)uVar14 + (uVar15 - 1);
            uVar12 = 0;
            uVar14 = uVar6;
            do {
              offset[0] = local_128;
              uVar11 = uVar14;
              if (uVar19 <= uVar14) {
                uVar11 = uVar19;
              }
              ws_part.workDims = 3;
              uVar9 = (int)uVar11 + (uVar16 - 1);
              ws_part.globalWorkSize[2] = (size_t)(uVar9 - uVar9 % uVar16);
              ws_part.localWorkSize[0] = uVar1 & 0xffffffff;
              ws_part.localWorkSize[1] = uVar2 & 0xffffffff;
              ws_part.localWorkSize[2] = uVar3 & 0xffffffff;
              ws_part.globalWorkSize[0] =
                   (ulong)(uVar8 - (int)((ulong)uVar8 % (uVar1 & 0xffffffff)));
              ws_part.globalWorkSize[1] = (ulong)(uVar13 - uVar13 % uVar15);
              offset[1] = uVar17;
              offset[2] = uVar12;
              gpu::Context::cl((Context *)local_b0);
              OpenCLEngine::ndRangeKernel
                        ((OpenCLEngine *)local_b0._0_8_,this_00,3,offset,ws_part.globalWorkSize,
                         ws_part.localWorkSize);
              if ((element_type *)local_b0._8_8_ != (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_);
              }
              uVar12 = uVar12 + uVar19;
              uVar14 = uVar14 - uVar19;
            } while (uVar12 < uVar6);
          }
          uVar17 = uVar17 + uVar7;
        } while (uVar17 < uVar5);
      }
      local_128 = local_128 + uVar18;
    } while (local_128 < uVar4);
  }
  if (context.data_ref_.super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (context.data_ref_.super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void KernelSource::execSubdivided(const gpu::WorkSize &ws, const Arg &arg0, const Arg &arg1, const Arg &arg2, const Arg &arg3, const Arg &arg4, const Arg &arg5, const Arg &arg6, const Arg &arg7, const Arg &arg8, const Arg &arg9, const Arg &arg10, const Arg &arg11, const Arg &arg12, const Arg &arg13, const Arg &arg14, const Arg &arg15, const Arg &arg16, const Arg &arg17, const Arg &arg18, const Arg &arg19, const Arg &arg20, const Arg &arg21, const Arg &arg22, const Arg &arg23, const Arg &arg24, const Arg &arg25, const Arg &arg26, const Arg &arg27, const Arg &arg28, const Arg &arg29, const Arg &arg30, const Arg &arg31, const Arg &arg32, const Arg &arg33, const Arg &arg34, const Arg &arg35, const Arg &arg36, const Arg &arg37, const Arg &arg38, const Arg &arg39, const Arg &arg40)
{
	const size_t max_total_size = 1000000;

	const size_t local_x = ws.clLocalSize()[0];
	const size_t local_y = ws.clLocalSize()[1];
	const size_t local_z = ws.clLocalSize()[2];

	const size_t total_x = ws.clGlobalSize()[0];
	const size_t total_y = ws.clGlobalSize()[1];
	const size_t total_z = ws.clGlobalSize()[2];

	size_t nparts_x = 1;
	size_t nparts_y = 1;
	size_t nparts_z = 1;

	size_t part_x = total_x;
	size_t part_y = total_y;
	size_t part_z = total_z;

	while (part_x * part_y * part_z > max_total_size && part_x > local_x) {
		nparts_x *= 2;
		part_x = local_x * gpu::divup(gpu::divup(total_x, nparts_x), local_x);
	}
	while (part_x * part_y * part_z > max_total_size && part_y > local_y) {
		nparts_y *= 2;
		part_y = local_y * gpu::divup(gpu::divup(total_y, nparts_y), local_y);
	}
	while (part_x * part_y * part_z > max_total_size && part_z > local_z) {
		nparts_z *= 2;
		part_z = local_z * gpu::divup(gpu::divup(total_z, nparts_z), local_z);
	}

	gpu::Context context;

	OpenCLKernel *kernel = getKernel(context.cl());

	kernel->setArgs(arg0, arg1, arg2, arg3, arg4, arg5, arg6, arg7, arg8, arg9, arg10, arg11, arg12, arg13, arg14, arg15, arg16, arg17, arg18, arg19, arg20, arg21, arg22, arg23, arg24, arg25, arg26, arg27, arg28, arg29, arg30, arg31, arg32, arg33, arg34, arg35, arg36, arg37, arg38, arg39, arg40);

	for (size_t offset_x = 0; offset_x < total_x; offset_x += part_x) {
		for (size_t offset_y = 0; offset_y < total_y; offset_y += part_y) {
			for (size_t offset_z = 0; offset_z < total_z; offset_z += part_z) {
				size_t offset[3];
				offset[0] = offset_x;
				offset[1] = offset_y;
				offset[2] = offset_z;

				size_t current_x = std::min(part_x, total_x - offset_x);
				size_t current_y = std::min(part_y, total_y - offset_y);
				size_t current_z = std::min(part_z, total_z - offset_z);

				gpu::WorkSize ws_part(local_x, local_y, local_z, current_x, current_y, current_z);

				// NOTTODO: generalize this logic, apply it to CUDA, make so that ndRangeKernel is called only in one place in codebase, remove all get_group_id/get_num_groups calls, etc.
				context.cl()->ndRangeKernel(*kernel, 3, offset, ws_part.clGlobalSize(), ws_part.clLocalSize());
			}
		}
	}
}